

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O0

int Mio_CommandReadProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  Mio_Library_t *pLib_00;
  FILE *__stream_00;
  char *pcVar2;
  int c;
  char *pFileName;
  Mio_Library_t *pLib;
  FILE *pErr;
  FILE *pOut;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (argc == globalUtilOptind + 1)) {
    pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
    if (pLib_00 == (Mio_Library_t *)0x0) {
      fprintf(__stream,"There is no Genlib library entered.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      pcVar2 = argv[globalUtilOptind];
      __stream_00 = (FILE *)Io_FileOpen(pcVar2,"open_path","r",0);
      if (__stream_00 == (FILE *)0x0) {
        fprintf(__stream,"Cannot open input file \"%s\". ",pcVar2);
        pcVar2 = Extra_FileGetSimilarName
                           (pcVar2,".profile",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        if (pcVar2 != (char *)0x0) {
          fprintf(__stream,"Did you mean \"%s\"?",pcVar2);
        }
        fprintf(__stream,"\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Mio_LibraryReadProfile((FILE *)__stream_00,pLib_00);
        fclose(__stream_00);
        pAbc_local._4_4_ = 0;
      }
    }
  }
  else {
    fprintf(__stream,"usage: read_profile [-h] <file>\n");
    fprintf(__stream,"\t          read a gate profile from a profile file\n");
    fprintf(__stream,"\t-h      : enable verbose output\n");
    fprintf(__stream,"\t<file>  : file name to read the profile\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Mio_CommandReadProfile( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile, * pOut, * pErr;
    Mio_Library_t * pLib;
    char * pFileName;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "h")) != EOF ) 
    {
        switch (c) 
        {
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
    {
        fprintf( pErr, "There is no Genlib library entered.\n" );
        return 1;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "r", 0 )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".profile", NULL, NULL, NULL, NULL )) )
            fprintf( pErr, "Did you mean \"%s\"?", pFileName );
        fprintf( pErr, "\n" );
        return 1;
    }

    // set the new network
    Mio_LibraryReadProfile( pFile, pLib );
    fclose( pFile );
    return 0;

usage:
    fprintf( pErr, "usage: read_profile [-h] <file>\n");
    fprintf( pErr, "\t          read a gate profile from a profile file\n" );  
    fprintf( pErr, "\t-h      : enable verbose output\n");
    fprintf( pErr, "\t<file>  : file name to read the profile\n");
    return 1;       
}